

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_StageDIRKNoFast(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int is,int *nflagPtr)

{
  int iVar1;
  
  step_mem->istage = is;
  iVar1 = mriStep_Predict(ark_mem,is,step_mem->zpred);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (step_mem->stage_predict != (ARKStagePredictFn)0x0) {
    iVar1 = (*step_mem->stage_predict)(ark_mem->tcur,step_mem->zpred,ark_mem->user_data);
    if (iVar1 < 0) {
      return -0x27;
    }
    if (iVar1 != 0) {
      return 5;
    }
  }
  iVar1 = mriStep_RKCoeffs(step_mem->MRIC,is,step_mem->stage_map,step_mem->Ae_row,step_mem->Ai_row);
  if ((iVar1 == 0) && (iVar1 = mriStep_StageSetup(ark_mem), iVar1 == 0)) {
    iVar1 = mriStep_Nls(ark_mem,*nflagPtr);
    *nflagPtr = iVar1;
    iVar1 = (uint)(iVar1 != 0) * 5;
  }
  return iVar1;
}

Assistant:

int mriStep_StageDIRKNoFast(ARKodeMem ark_mem, ARKodeMRIStepMem step_mem,
                            int is, int *nflagPtr)
{
  int retval;

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep DIRK stage\n");
#endif

  /* store current stage index */
  step_mem->istage = is;

  /* Call predictor for current stage solution (result placed in zpred) */
  retval = mriStep_Predict(ark_mem, is, step_mem->zpred);
  if (retval != ARK_SUCCESS)  return (retval);

  /* If a user-supplied predictor routine is provided, call that here
     Note that mriStep_Predict is *still* called, so this user-supplied
     routine can just 'clean up' the built-in prediction, if desired. */
  if (step_mem->stage_predict) {
    retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                     ark_mem->user_data);
    if (retval < 0)  return(ARK_USER_PREDICT_FAIL);
    if (retval > 0)  return(TRY_AGAIN);
  }

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    MRIStep predictor:\n");
  N_VPrint(step_mem->zpred);
#endif

  /* determine effective DIRK coefficients (store in cvals) */
  retval = mriStep_RKCoeffs(step_mem->MRIC, is, step_mem->stage_map,
                            step_mem->Ae_row, step_mem->Ai_row);
  if (retval != ARK_SUCCESS) { return(retval); }

  /* Set up data for evaluation of DIRK stage residual (data stored in sdata) */
  retval = mriStep_StageSetup(ark_mem);
  if (retval != ARK_SUCCESS)  return (retval);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    MRIStep rhs data:\n");
  N_VPrint(step_mem->sdata);
#endif

  /* perform implicit solve (result is stored in ark_mem->ycur); return
     with positive value on anything but success */
  *nflagPtr = mriStep_Nls(ark_mem, *nflagPtr);
  if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);

  return(ARK_SUCCESS);
}